

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O3

bool __thiscall
BuildLog::RecordCommand(BuildLog *this,Edge *edge,int start_time,int end_time,TimeStamp mtime)

{
  Node *pNVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  uint64_t uVar6;
  iterator iVar7;
  string *psVar8;
  size_t extraout_RDX;
  __hashtable *__h;
  pointer ppNVar9;
  StringPiece command_00;
  string command;
  key_type local_70;
  string *local_60;
  TimeStamp local_58;
  string local_50;
  
  local_58 = mtime;
  Edge::EvaluateCommand_abi_cxx11_(&local_50,edge,true);
  _Var3._M_p = local_50._M_dataplus._M_p;
  command_00.len_ = extraout_RDX;
  command_00.str_ = (char *)local_50._M_string_length;
  uVar6 = LogEntry::HashCommand((LogEntry *)local_50._M_dataplus._M_p,command_00);
  ppNVar9 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar9 ==
      (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar4 = true;
    local_50._M_dataplus._M_p = _Var3._M_p;
  }
  else {
    do {
      pNVar1 = *ppNVar9;
      local_70.str_ = (pNVar1->path_)._M_dataplus._M_p;
      local_70.len_ = (pNVar1->path_)._M_string_length;
      iVar7 = std::
              _Hashtable<StringPiece,_std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<StringPiece,_std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this,&local_70);
      if (iVar7.super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>.
          _M_cur == (__node_type *)0x0) {
        psVar8 = (string *)operator_new(0x38);
        *(string **)psVar8 = psVar8 + 0x10;
        pcVar2 = (pNVar1->path_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  (psVar8,pcVar2,pcVar2 + (pNVar1->path_)._M_string_length);
        local_70.str_ = *(char **)psVar8;
        local_70.len_ = *(size_t *)(psVar8 + 8);
        local_60 = psVar8;
        std::
        _Hashtable<StringPiece,std::pair<StringPiece_const,BuildLog::LogEntry*>,std::allocator<std::pair<StringPiece_const,BuildLog::LogEntry*>>,std::__detail::_Select1st,std::equal_to<StringPiece>,std::hash<StringPiece>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<StringPiece_const,BuildLog::LogEntry*>>
                  ((_Hashtable<StringPiece,std::pair<StringPiece_const,BuildLog::LogEntry*>,std::allocator<std::pair<StringPiece_const,BuildLog::LogEntry*>>,std::__detail::_Select1st,std::equal_to<StringPiece>,std::hash<StringPiece>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)this,&local_70);
      }
      else {
        psVar8 = *(string **)
                  ((long)iVar7.
                         super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                         ._M_cur + 0x18);
      }
      *(uint64_t *)(psVar8 + 0x20) = uVar6;
      *(int *)(psVar8 + 0x28) = start_time;
      *(int *)(psVar8 + 0x2c) = end_time;
      *(TimeStamp *)(psVar8 + 0x30) = local_58;
      bVar4 = OpenForWriteIfNeeded(this);
      if (!bVar4) {
LAB_00106fe6:
        bVar4 = false;
        goto LAB_00106fed;
      }
      if ((FILE *)this->log_file_ != (FILE *)0x0) {
        bVar4 = false;
        iVar5 = fprintf((FILE *)this->log_file_,"%d\t%d\t%ld\t%s\t%lx\n",
                        (ulong)*(uint *)(psVar8 + 0x28),(ulong)*(uint *)(psVar8 + 0x2c),
                        *(undefined8 *)(psVar8 + 0x30),*(undefined8 *)psVar8,
                        *(undefined8 *)(psVar8 + 0x20));
        if (iVar5 < 1) goto LAB_00106fed;
        iVar5 = fflush((FILE *)this->log_file_);
        if (iVar5 != 0) goto LAB_00106fe6;
      }
      ppNVar9 = ppNVar9 + 1;
    } while (ppNVar9 !=
             (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    bVar4 = true;
  }
LAB_00106fed:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool BuildLog::RecordCommand(Edge* edge, int start_time, int end_time,
                             TimeStamp mtime) {
  string command = edge->EvaluateCommand(true);
  uint64_t command_hash = LogEntry::HashCommand(command);
  for (vector<Node*>::iterator out = edge->outputs_.begin();
       out != edge->outputs_.end(); ++out) {
    const string& path = (*out)->path();
    Entries::iterator i = entries_.find(path);
    LogEntry* log_entry;
    if (i != entries_.end()) {
      log_entry = i->second;
    } else {
      log_entry = new LogEntry(path);
      entries_.insert(Entries::value_type(log_entry->output, log_entry));
    }
    log_entry->command_hash = command_hash;
    log_entry->start_time = start_time;
    log_entry->end_time = end_time;
    log_entry->mtime = mtime;

    if (!OpenForWriteIfNeeded()) {
      return false;
    }
    if (log_file_) {
      if (!WriteEntry(log_file_, *log_entry))
        return false;
      if (fflush(log_file_) != 0) {
          return false;
      }
    }
  }
  return true;
}